

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O0

void immutable::rrb_details::ensure_leaf_editable<int,false,6>
               (ref<immutable::rrb_details::leaf_node<int,_false>_> *leaf,guid_type guid)

{
  leaf_node<int,_false> *plVar1;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_20;
  guid_type local_14;
  ref<immutable::rrb_details::leaf_node<int,_false>_> *prStack_10;
  guid_type guid_local;
  ref<immutable::rrb_details::leaf_node<int,_false>_> *leaf_local;
  
  local_14 = guid;
  prStack_10 = leaf;
  plVar1 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->(leaf);
  if (plVar1->guid != local_14) {
    plVar1 = transient_leaf_node_clone<int,false,6>(prStack_10->ptr,local_14);
    ref<immutable::rrb_details::leaf_node<int,_false>_>::ref(&local_20,plVar1);
    ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(prStack_10,&local_20);
    ref<immutable::rrb_details::leaf_node<int,_false>_>::~ref(&local_20);
  }
  return;
}

Assistant:

inline void ensure_leaf_editable(ref<leaf_node<T, atomic_ref_counting>>& leaf, guid_type guid)
      {
      if (leaf->guid != guid)
        {
        leaf = transient_leaf_node_clone<T, atomic_ref_counting, N>(leaf.ptr, guid);
        }
      }